

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_test.c
# Opt level: O3

int main(void)

{
  sbyte sVar1;
  uint8_t uVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  uint i_1;
  ulong uVar14;
  uint i;
  ulong uVar15;
  bool bVar16;
  uint8_t buffer [8];
  
  uVar14 = 0xfffffffffffffff9;
  uVar10 = 0xfffffff1;
  uVar15 = 1;
  iVar9 = 0;
  do {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    uVar12 = 1L << ((ulong)((int)uVar15 - 1) & 0x3f);
    uVar7 = uVar15;
    if (uVar15 < 8) {
      bVar13 = 0;
      pbVar4 = buffer;
LAB_001011bf:
      bVar6 = (byte)uVar7;
      sVar1 = (bVar6 < 0x21) * (' ' - bVar6);
      *pbVar4 = (char)((uint)((int)uVar12 << sVar1) >> sVar1) << ((ulong)(byte)(8 - bVar6) & 0x3f) |
                (byte)(0xff >> ((uint)uVar7 & 0x1f)) & bVar13;
    }
    else {
      lVar8 = (uVar14 >> 3) + 1;
      pbVar4 = buffer;
      do {
        uVar7 = uVar7 - 8;
        *pbVar4 = (byte)(uVar12 >> (uVar7 & 0x3f));
        pbVar4 = pbVar4 + 1;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      if (uVar7 != 0) {
        bVar13 = *pbVar4;
        goto LAB_001011bf;
      }
    }
    uVar2 = buffer[0];
    uVar7 = (ulong)buffer & 0xff;
    if (uVar15 < 9) {
      uVar7 = (ulong)(buffer[0] >> ((ulong)(byte)(8 - (char)uVar15) & 0x3f));
    }
    else {
      uVar3 = (int)uVar15 - 8;
      uVar5 = (ulong)uVar3;
      if (uVar3 < 8) {
        pbVar4 = buffer + 1;
      }
      else {
        pbVar4 = buffer + 1;
        lVar8 = 0;
        do {
          bVar13 = *pbVar4;
          pbVar4 = pbVar4 + 1;
          lVar8 = lVar8 + 8;
          uVar7 = (ulong)bVar13 | uVar7 << 8;
        } while ((ulong)(uVar10 & 0xfffffff8) + 8 != lVar8);
        if (uVar3 == (uint)lVar8) goto LAB_0010125b;
        uVar5 = (ulong)uVar3 - lVar8;
      }
      bVar13 = (byte)uVar5;
      sVar1 = (bVar13 < 0x21) * (' ' - bVar13);
      uVar7 = (ulong)(((uint)(*pbVar4 >> ((byte)(8 - bVar13) & 0x1f)) << sVar1) >> sVar1) |
              uVar7 << (uVar5 & 0x3f);
    }
LAB_0010125b:
    if (uVar7 != uVar12) {
      printf("simple_test: expected %016lx, got %016lx\n");
      iVar9 = -1;
    }
    if (uVar2 == 0x80) {
      if (uVar15 == 0x40) break;
    }
    else {
      printf("simple_test: expected buffer 80000000000000000000, got %02x%02x%02x%02x%02x%02x%02x%02x\n"
             ,(ulong)(uint)uVar2,(ulong)buffer >> 8 & 0xff,(ulong)buffer >> 0x10 & 0xff,
             (ulong)buffer >> 0x18 & 0xff,(ulong)buffer >> 0x20 & 0xff,(ulong)buffer >> 0x28 & 0xff,
             (ulong)buffer >> 0x30 & 0xff,(ulong)buffer >> 0x38);
      iVar9 = -1;
      if (uVar15 == 0x40) goto LAB_001012ec;
    }
    uVar15 = uVar15 + 1;
    uVar14 = uVar14 + 1;
    uVar10 = uVar10 + 1;
  } while( true );
  if (iVar9 == 0) {
    iVar9 = 0;
  }
  else {
LAB_001012ec:
    puts("simple_test: failed!");
  }
  uVar14 = 0x1d;
  uVar15 = 0;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  do {
    uVar7 = uVar15 >> 3;
    if ((uVar15 & 7) == 0) {
      bVar13 = (byte)(0x1b0d94a500 >> (uVar14 & 0x3f)) & 0x80 | buffer[uVar7] & 0x7f;
    }
    else {
      bVar13 = (byte)((0x361b294aU >> ((uint)uVar14 & 0x1f)) << ((byte)uVar15 & 7 ^ 7)) |
               (byte)(0xff7f >> ((byte)uVar15 & 7)) & buffer[uVar7];
    }
    uVar15 = uVar15 + 1;
    uVar14 = uVar14 - 1;
    buffer[uVar7] = bVar13;
  } while (uVar15 != 0x1e);
  uVar15 = 0x1d;
  iVar11 = 0;
  uVar14 = 0;
  do {
    bVar13 = 8 - (char)(uVar14 & 0xffffff07);
    sVar1 = (bVar13 < 0x21) * (' ' - bVar13);
    if (((uint)(0x361b294aL >> (uVar15 & 0x3f)) & 1) !=
        (((uint)buffer[uVar14 >> 3] << sVar1) >> sVar1) >> ((uVar14 & 0xffffff07 ^ 7) & 0x3f)) {
      printf("test_30: expected2 %016lx, got %016lx\n");
      iVar11 = -1;
    }
    uVar14 = uVar14 + 1;
    bVar16 = uVar15 != 0;
    uVar15 = uVar15 - 1;
  } while (bVar16);
  if (buffer[3] == '(' && (buffer[2] == 0xa5 && (buffer[1] == 'l' && buffer[0] == 0xd8))) {
    if (iVar11 == 0) goto LAB_00101465;
  }
  else {
    printf("test_30: expected buffer2 %016lx, got %02x%02x%02x%02x%02x%02x%02x%02x\n",
           0xd86ca52800000000,(ulong)buffer & 0xff,(ulong)buffer[1],(ulong)buffer[2],
           (ulong)buffer[3],(ulong)buffer >> 0x20 & 0xff,(ulong)buffer >> 0x28 & 0xff,
           (ulong)buffer >> 0x30 & 0xff,(ulong)buffer >> 0x38);
    iVar11 = -1;
  }
  iVar9 = iVar11;
  puts("test_30: failed!");
LAB_00101465:
  uVar14 = 0;
  buffer[0] = 0xd8;
  buffer[1] = 'l';
  buffer[2] = 0xa5;
  buffer[3] = '(';
  buffer[4] = 0x9e;
  buffer[5] = 'M';
  buffer[6] = 'k';
  buffer[7] = 'P';
  lVar8 = 4;
  do {
    pbVar4 = buffer + lVar8;
    lVar8 = lVar8 + 1;
    uVar14 = (ulong)*pbVar4 | uVar14 << 8;
  } while (lVar8 != 7);
  if (uVar14 * 0x10 != 0x9e4d6b0) {
    printf("test_multiple_30: expected %016lx, got %016lx\n",0x9e4d6b5,uVar14 * 0x10 | 5);
    puts("test_multiple_30: failed!");
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(void) {
  int ret = 0;

  int tmp = simple_test();
  if (tmp) {
    printf("simple_test: failed!\n");
    ret = tmp;
  }

  tmp = test_30();
  if (tmp) {
    printf("test_30: failed!\n");
    ret = tmp;
  }

  tmp = test_multiple_30();
  if (tmp) {
    printf("test_multiple_30: failed!\n");
    ret = tmp;
  }

  return ret;
}